

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.c
# Opt level: O0

int disassemble_arm(uint32_t address,uint32_t raw_arm,char *buf,int buflen)

{
  int in_ECX;
  char *in_RDX;
  
  snprintf(in_RDX,(long)in_ECX,"[Disassembly Unsupported]");
  return 1;
}

Assistant:

int disassemble_arm(word address, word raw_arm, char* buf, int buflen) {
#ifdef HAVE_CAPSTONE
    byte code[4];
    code[0] = raw_arm & 0xFF;
    code[1] = (raw_arm >> 8) & 0xFF;
    code[2] = (raw_arm >> 16) & 0xFF;
    code[3] = (raw_arm >> 24) & 0xFF;
    disassembler_initialize();
    size_t count = cs_disasm(handle_arm, code, 4, address, 0, &insn);
    if (count == 0) {
        logwarn("Failed to disassemble code!")
        snprintf(buf, buflen, "ERROR! big (0x%08X) little (0x%08X)", raw_arm, FAKELITTLE_WORD(raw_arm));
        return 0;
    } else if (count > 1) {
        logwarn("Given more than one instruction, only disassembling the first one!")
    }

    snprintf(buf, buflen, "%s %s", insn[0].mnemonic, insn[0].op_str);

    cs_free(insn, count);
#else
    snprintf(buf, buflen, "[Disassembly Unsupported]");
#endif
    return 1;
}